

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckReference
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlAttrPtr attr,
              xmlChar *namespaceName)

{
  int iVar1;
  xmlNodePtr local_50;
  xmlNodePtr n;
  xmlSchemaSchemaRelationPtr_conflict rel;
  xmlChar *namespaceName_local;
  xmlAttrPtr attr_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  iVar1 = xmlStrEqual(pctxt->targetNamespace,namespaceName);
  if (iVar1 == 0) {
    iVar1 = xmlStrEqual(xmlSchemaNs,namespaceName);
    if (iVar1 == 0) {
      if (pctxt->constructor->bucket->relations != (xmlSchemaSchemaRelationPtr_conflict)0x0) {
        n = (xmlNodePtr)pctxt->constructor->bucket->relations;
        do {
          if (((n->type == 0) || (n->type == XML_ELEMENT_NODE)) &&
             (iVar1 = xmlStrEqual(namespaceName,n->name), iVar1 != 0)) {
            return 0;
          }
          n = (xmlNodePtr)n->_private;
        } while (n != (xmlNodePtr)0x0);
      }
      local_50 = node;
      if (attr != (xmlAttrPtr)0x0) {
        local_50 = (xmlNodePtr)attr;
      }
      if (namespaceName == (xmlChar *)0x0) {
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_RESOLVE,local_50,
                           (xmlSchemaBasicItemPtr)0x0,
                           "References from this schema to components in no namespace are not allowed, since not indicated by an import statement"
                           ,(xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_RESOLVE,local_50,
                           (xmlSchemaBasicItemPtr)0x0,
                           "References from this schema to components in the namespace \'%s\' are not allowed, since not indicated by an import statement"
                           ,namespaceName,(xmlChar *)0x0);
      }
      pctxt_local._4_4_ = 0xbbc;
    }
    else {
      pctxt_local._4_4_ = 0;
    }
  }
  else {
    pctxt_local._4_4_ = 0;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckReference(xmlSchemaParserCtxtPtr pctxt,
		  xmlSchemaPtr schema ATTRIBUTE_UNUSED,
		  xmlNodePtr node,
		  xmlAttrPtr attr,
		  const xmlChar *namespaceName)
{
    /* TODO: Pointer comparison instead? */
    if (xmlStrEqual(pctxt->targetNamespace, namespaceName))
	return (0);
    if (xmlStrEqual(xmlSchemaNs, namespaceName))
	return (0);
    /*
    * Check if the referenced namespace was <import>ed.
    */
    if (WXS_BUCKET(pctxt)->relations != NULL) {
	xmlSchemaSchemaRelationPtr rel;

	rel = WXS_BUCKET(pctxt)->relations;
	do {
	    if (WXS_IS_BUCKET_IMPMAIN(rel->type) &&
		xmlStrEqual(namespaceName, rel->importNamespace))
		return (0);
	    rel = rel->next;
	} while (rel != NULL);
    }
    /*
    * No matching <import>ed namespace found.
    */
    {
	xmlNodePtr n = (attr != NULL) ? (xmlNodePtr) attr : node;

	if (namespaceName == NULL)
	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		XML_SCHEMAP_SRC_RESOLVE, n, NULL,
		"References from this schema to components in no "
		"namespace are not allowed, since not indicated by an "
		"import statement", NULL, NULL);
	else
	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		XML_SCHEMAP_SRC_RESOLVE, n, NULL,
		"References from this schema to components in the "
		"namespace '%s' are not allowed, since not indicated by an "
		"import statement", namespaceName, NULL);
    }
    return (XML_SCHEMAP_SRC_RESOLVE);
}